

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_u16string_equal_null(void)

{
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78);
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"\") == variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x9a8,"void equality_suite::compare_u16string_equal_null()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"\") != variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x9a9,"void equality_suite::compare_u16string_equal_null()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"charlie\") == variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x9aa,"void equality_suite::compare_u16string_equal_null()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"charlie\") != variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x9ab,"void equality_suite::compare_u16string_equal_null()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  return;
}

Assistant:

void compare_u16string_equal_null()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"") == variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"") != variable(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"charlie") == variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"charlie") != variable(), true);
}